

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O1

void Fl_Widget::default_callback(Fl_Widget *o,void *param_2)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = (long)obj_head;
  obj_head = obj_head + 1;
  obj_queue[lVar3] = o;
  if (0x12 < lVar3) {
    obj_head = 0;
  }
  if (obj_head == obj_tail) {
    iVar1 = obj_tail + 1;
    bVar2 = obj_tail < 0x13;
    obj_tail = 0;
    if (bVar2) {
      obj_tail = iVar1;
    }
  }
  return;
}

Assistant:

void Fl_Widget::default_callback(Fl_Widget *o, void * /*v*/) {
#if 0
  // This is necessary for strict forms compatibility but is confusing.
  // Use the parent's callback if this widget does not have one.
  for (Fl_Widget *p = o->parent(); p; p = p->parent())
    if (p->callback() != default_callback) {
      p->do_callback(o,v);
      return;
    }
#endif
  obj_queue[obj_head++] = o;
  if (obj_head >= QUEUE_SIZE) obj_head = 0;
  if (obj_head == obj_tail) {
    obj_tail++;
    if (obj_tail >= QUEUE_SIZE) obj_tail = 0;
  }
}